

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O0

void dcopy(int n,double *dx,int incx,double *dy,int incy)

{
  int iVar1;
  int local_38;
  int m;
  int iy;
  int ix;
  int i;
  int incy_local;
  double *dy_local;
  int incx_local;
  double *dx_local;
  int n_local;
  
  if (0 < n) {
    if ((incx == 1) && (incy == 1)) {
      iVar1 = n % 7;
      if (iVar1 != 0) {
        for (iy = 0; iy < iVar1; iy = iy + 1) {
          dy[iy] = dx[iy];
        }
      }
      while (iy = iVar1, iy < n) {
        dy[iy] = dx[iy];
        dy[iy + 1] = dx[iy + 1];
        dy[iy + 2] = dx[iy + 2];
        dy[iy + 3] = dx[iy + 3];
        dy[iy + 4] = dx[iy + 4];
        dy[iy + 5] = dx[iy + 5];
        dy[iy + 6] = dx[iy + 6];
        iVar1 = iy + 7;
      }
    }
    else {
      if (incx < 0) {
        m = (1 - n) * incx;
      }
      else {
        m = 0;
      }
      if (incy < 0) {
        local_38 = (1 - n) * incy;
      }
      else {
        local_38 = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        dy[local_38] = dx[m];
        m = m + incx;
        local_38 = local_38 + incy;
      }
    }
  }
  return;
}

Assistant:

void dcopy ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DCOPY copies a vector X to a vector Y.
//
//  Discussion:
//
//    The routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in DX and DY.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries of DX.
//
//    Output, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries of DY.
//
{
  int i;
  int ix;
  int iy;
  int m;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    m = n % 7;

    if ( m != 0 )
    {
      for ( i = 0; i < m; i++ )
      {
        dy[i] = dx[i];
      }
    }

    for ( i = m; i < n; i = i + 7 )
    {
      dy[i] = dx[i];
      dy[i + 1] = dx[i + 1];
      dy[i + 2] = dx[i + 2];
      dy[i + 3] = dx[i + 3];
      dy[i + 4] = dx[i + 4];
      dy[i + 5] = dx[i + 5];
      dy[i + 6] = dx[i + 6];
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dy[iy] = dx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }

  }

  return;
}